

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_tet_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  ulong uVar9;
  int iVar10;
  REF_INT RVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90;
  REF_INT local_8c [25];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    uVar9 = (ulong)uVar4;
    pcVar15 = "create";
    uVar8 = 0x61;
    goto LAB_00119010;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar10 = 0;
  iVar5 = (int)(3 / (long)iVar6);
  iVar13 = iVar5 * iVar6;
  if (3 < iVar13) {
    iVar10 = ((((iVar6 + 3) / iVar6) * (iVar13 + -4)) / iVar5 - iVar13) + 4;
  }
  if (iVar7 == iVar10) {
LAB_0011881e:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar8 = 0x72;
      goto LAB_00119010;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local_98;
    pRVar3 = pRVar2 + lVar14 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar14 * 0xf + 2] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar14) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar12 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar12 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar12 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar7);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar11 = iVar6 + (int)((lVar12 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar11;
    uVar4 = ref_node_add(ref_node,1,&local_94);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar8 = 0x73;
      goto LAB_00119010;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local_94;
    pRVar3[lVar14 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar14 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar14) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar12 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar12 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar12 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar7);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar11 = iVar6 + (int)((lVar12 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar11;
    uVar4 = ref_node_add(ref_node,2,&local_90);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar8 = 0x74;
      goto LAB_00119010;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local_90;
    pRVar3 = pRVar2 + lVar14 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar14 * 0xf + 2] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar14) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar12 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar12 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar12 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar7);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar11 = iVar6 + (int)((lVar12 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar11;
    uVar4 = ref_node_add(ref_node,3,local_8c);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar8 = 0x75;
      goto LAB_00119010;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar14 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar14 * 0xf + 2] = 1.0;
    lVar12 = -1;
    if (((-1 < lVar14) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar12 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar12 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar12 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar7);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar12 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar11 = iVar6 + (int)((lVar12 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar11;
    uVar4 = ref_cell_add(pRVar1->cell[8],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "add tet";
      uVar8 = 0x77;
      goto LAB_00119010;
    }
  }
  else {
    iVar6 = (iVar6 + 3) / iVar6;
    iVar10 = 0;
    if (iVar6 + 1U < 3) {
      iVar10 = iVar6;
    }
    iVar13 = 4 - iVar13;
    if (iVar13 <= iVar10) {
      iVar10 = (1 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar10) goto LAB_0011881e;
    iVar10 = (int)(2 / (long)iVar6);
    if (iVar13 <= iVar10) {
      iVar10 = (2 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar10) goto LAB_0011881e;
    iVar10 = (int)(3 / (long)iVar6);
    if (iVar13 <= iVar10) {
      iVar10 = (3 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar10) goto LAB_0011881e;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,4);
  if (uVar4 != 0) {
    uVar9 = (ulong)uVar4;
    pcVar15 = "init glob";
    uVar8 = 0x7a;
    goto LAB_00119010;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar10 = 0;
  iVar5 = (int)(3 / (long)iVar6);
  iVar13 = iVar5 * iVar6;
  if (3 < iVar13) {
    iVar10 = ((((iVar6 + 3) / iVar6) * (iVar13 + -4)) / iVar5 - iVar13) + 4;
  }
  if (iVar7 == iVar10) {
LAB_00118dde:
    uVar4 = ref_node_local(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar8 = 0x86;
      goto LAB_00119010;
    }
    uVar4 = ref_node_local(ref_node,1,&local_94);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar8 = 0x87;
      goto LAB_00119010;
    }
    uVar4 = ref_node_local(ref_node,2,&local_90);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar8 = 0x88;
      goto LAB_00119010;
    }
    local_8c[0] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar15 = "add tri";
      uVar8 = 0x8a;
      goto LAB_00119010;
    }
    iVar10 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar6 = (iVar10 + 3) / iVar10;
    uVar4 = iVar6 + 1;
    iVar5 = (int)(3 / (long)iVar10);
    iVar13 = 4 - iVar5 * iVar10;
  }
  else {
    iVar6 = (iVar6 + 3) / iVar6;
    uVar4 = iVar6 + 1;
    iVar10 = 0;
    if (uVar4 < 3) {
      iVar10 = iVar6;
    }
    iVar13 = 4 - iVar13;
    if (iVar13 <= iVar10) {
      iVar10 = (1 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar10) goto LAB_00118dde;
    iVar10 = (int)(2 / (long)iVar6);
    if (iVar13 <= iVar10) {
      iVar10 = (2 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar10) goto LAB_00118dde;
  }
  iVar10 = 0;
  if (uVar4 < 3) {
    iVar10 = iVar6;
  }
  if (iVar13 <= iVar10) {
    iVar10 = (1 - iVar13 * iVar6) / iVar5 + iVar13;
  }
  if (iVar7 != iVar10) {
    iVar10 = (int)(2 / (long)iVar6);
    if (iVar13 <= iVar10) {
      iVar10 = (2 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 != iVar10) {
      return 0;
    }
  }
  uVar4 = ref_node_local(ref_node,1,&local_98);
  if (uVar4 == 0) {
    uVar4 = ref_node_local(ref_node,2,&local_94);
    if (uVar4 == 0) {
      local_8c[0] = 0x14;
      uVar4 = ref_cell_add(pRVar1->cell[0],&local_98,&local_9c);
      if (uVar4 == 0) {
        return 0;
      }
      uVar9 = (ulong)uVar4;
      pcVar15 = "add edg";
      uVar8 = 0x97;
    }
    else {
      uVar9 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar8 = 0x95;
    }
  }
  else {
    uVar9 = (ulong)uVar4;
    pcVar15 = "loc";
    uVar8 = 0x94;
  }
LAB_00119010:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_tet_grid",uVar9,pcVar15);
  return (REF_STATUS)uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 4;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add tet");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 1;
  global[1] = 2;
  global[3] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}